

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

void __thiscall Centaurus::LookaheadDFA<unsigned_char>::minimize(LookaheadDFA<unsigned_char> *this)

{
  pointer pNVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  pointer pLVar6;
  iterator iVar7;
  pointer pLVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  iterator __begin0;
  pointer pLVar12;
  pointer pNVar13;
  ulong uVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  vector<int,_std::allocator<int>_> remap;
  unordered_map<Centaurus::LDFAState<unsigned_char>,_int,_std::hash<Centaurus::LDFAState<unsigned_char>_>,_std::equal_to<Centaurus::LDFAState<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>_>_>
  equiv_map;
  int local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  vector<bool,_std::allocator<bool>_> local_90;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_68[0] = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,
             ((long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
             (bool *)local_68,(allocator_type *)&local_a8);
  local_68._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,
             ((long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
             (value_type_conflict *)local_68,(allocator_type *)&local_ac);
  local_68._0_8_ = local_40 + 8;
  local_ac = 0;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  pLVar8 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar8 == pLVar6) {
    uVar11 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar7 = std::
              _Hashtable<Centaurus::LDFAState<unsigned_char>,_std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<unsigned_char>_>,_std::hash<Centaurus::LDFAState<unsigned_char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<Centaurus::LDFAState<unsigned_char>,_std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<unsigned_char>_>,_std::hash<Centaurus::LDFAState<unsigned_char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_68,pLVar6 + uVar9);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<Centaurus::LDFAState<unsigned_char>,std::pair<Centaurus::LDFAState<unsigned_char>const,int>,std::allocator<std::pair<Centaurus::LDFAState<unsigned_char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<unsigned_char>>,std::hash<Centaurus::LDFAState<unsigned_char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<Centaurus::LDFAState<unsigned_char>&,int&>
                  ((_Hashtable<Centaurus::LDFAState<unsigned_char>,std::pair<Centaurus::LDFAState<unsigned_char>const,int>,std::allocator<std::pair<Centaurus::LDFAState<unsigned_char>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<unsigned_char>>,std::hash<Centaurus::LDFAState<unsigned_char>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_68,
                   (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_ac,&local_ac);
      }
      else {
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_ac] =
             *(int *)((long)iVar7.
                            super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_true>
                            ._M_cur + 0x58);
        iVar5 = local_ac + 0x3f;
        if (-1 < (long)local_ac) {
          iVar5 = local_ac;
        }
        bVar2 = (byte)local_ac & 0x3f;
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar5 >> 6) +
         ((ulong)(((long)local_ac & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
             local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar5 >> 6) +
              ((ulong)(((long)local_ac & 0x800000000000003fU) < 0x8000000000000001) - 1)] &
             (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      local_ac = local_ac + 1;
      uVar9 = (ulong)local_ac;
      pLVar8 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pLVar6 = (this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)pLVar8 - (long)pLVar6 >> 4) * -0x3333333333333333;
    } while (uVar9 <= uVar11 && uVar11 - uVar9 != 0);
  }
  if (uVar11 != 0) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx512f(_DAT_0016b900);
    auVar20 = vpmovsxwd_avx512f(_DAT_0016b920);
    uVar9 = 0;
    do {
      if ((-1 < local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9]) && (pLVar6 != pLVar8)) {
        auVar21 = vpbroadcastq_avx512f();
        auVar22 = vpbroadcastd_avx512f();
        pLVar12 = pLVar6;
        do {
          pNVar13 = (pLVar12->
                    super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                    ).m_transitions.
                    super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar1 = (pLVar12->
                   super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                   ).m_transitions.
                   super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pNVar13 != pNVar1) {
            auVar23 = vpbroadcastq_avx512f();
            uVar14 = 0;
            uVar10 = (ulong)((long)pNVar1 + (-0x38 - (long)pNVar13)) / 0x38 + 0x10 &
                     0xfffffffffffffff0;
            do {
              auVar24 = vpbroadcastq_avx512f();
              uVar14 = uVar14 + 0x10;
              auVar25 = vporq_avx512f(auVar24,auVar18);
              auVar24 = vporq_avx512f(auVar24,auVar19);
              uVar3 = vpcmpuq_avx512f(auVar24,auVar23,2);
              uVar4 = vpcmpuq_avx512f(auVar25,auVar23,2);
              bVar2 = (byte)uVar4;
              uVar15 = CONCAT11(bVar2,(byte)uVar3);
              auVar24 = vpgatherdd_avx512f(*(undefined4 *)((long)&pNVar13->m_dest + uVar10));
              auVar16._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar24._4_4_;
              auVar16._0_4_ = (uint)((byte)uVar3 & 1) * auVar24._0_4_;
              auVar16._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar24._8_4_;
              auVar16._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar24._12_4_;
              auVar16._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar24._16_4_;
              auVar16._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar24._20_4_;
              auVar16._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar24._24_4_;
              auVar16._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar24._28_4_;
              auVar25._32_4_ = (uint)(bVar2 & 1) * auVar24._32_4_;
              auVar25._0_32_ = auVar16;
              auVar25._36_4_ = (uint)(bVar2 >> 1 & 1) * auVar24._36_4_;
              auVar25._40_4_ = (uint)(bVar2 >> 2 & 1) * auVar24._40_4_;
              auVar25._44_4_ = (uint)(bVar2 >> 3 & 1) * auVar24._44_4_;
              auVar25._48_4_ = (uint)(bVar2 >> 4 & 1) * auVar24._48_4_;
              auVar25._52_4_ = (uint)(bVar2 >> 5 & 1) * auVar24._52_4_;
              auVar25._56_4_ = (uint)(bVar2 >> 6 & 1) * auVar24._56_4_;
              auVar25._60_4_ = (uint)(bVar2 >> 7) * auVar24._60_4_;
              auVar17 = vextracti64x4_avx512f(auVar25,1);
              auVar24 = vpmovzxdq_avx512f(auVar16);
              auVar25 = vpmovzxdq_avx512f(auVar17);
              uVar3 = vpcmpeqq_avx512f(auVar21,auVar24);
              uVar4 = vpcmpeqq_avx512f(auVar21,auVar25);
              vpscatterdd_avx512f(ZEXT864(pNVar13) + auVar20,
                                  (ulong)(uVar15 & CONCAT11((char)uVar4,(char)uVar3)),auVar22);
              pNVar13 = pNVar13 + 0x10;
            } while (uVar10 != uVar14);
          }
          pLVar12 = pLVar12 + 1;
        } while (pLVar12 != pLVar8);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar11);
  }
  filter_nodes(this,&local_90);
  std::
  _Hashtable<Centaurus::LDFAState<unsigned_char>,_std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<unsigned_char>_>,_std::hash<Centaurus::LDFAState<unsigned_char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::LDFAState<unsigned_char>,_std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<unsigned_char>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<unsigned_char>_>,_std::hash<Centaurus::LDFAState<unsigned_char>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void minimize()
    {
        std::vector<bool> mask(m_states.size(), true);
        std::vector<int> remap(m_states.size(), -1);

        std::unordered_map<LDFAState<TCHAR>, int> equiv_map;

        for (int index = 0; index < m_states.size(); index++)
        {
            auto p = equiv_map.find(m_states[index]);
            if (p != equiv_map.end())
            {
                remap[index] = p->second;
                mask[index] = false;
            }
            else
            {
                equiv_map.emplace(m_states[index], index);
            }
        }

        for (int index = 0; index < m_states.size(); index++)
        {
            if (remap[index] >= 0)
            {
                redirect_transitions(index, remap[index]);
            }
        }
        filter_nodes(mask);
    }